

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr Infoclr_change_fg(Pixell fg)

{
  errr in_EAX;
  errr eVar1;
  
  if (metadpy_default_15 < fg) {
    return in_EAX;
  }
  eVar1 = XSetForeground(metadpy_default_0,Infoclr->gc,fg);
  return eVar1;
}

Assistant:

static errr Infoclr_change_fg(Pixell fg)
{
	infoclr *iclr = Infoclr;


	/*** Simple error checking of opr and clr ***/

	/* Check the 'Pixells' for realism */
	if (fg > Metadpy->zg) return (-1);

	/*** Change ***/

	/* Change */
	XSetForeground(Metadpy->dpy, iclr->gc, fg);

	/* Success */
	return (0);
}